

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

int * Extra_PermSchedule(int n)

{
  int iVar1;
  int *piVar2;
  int *__ptr;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar23;
  uint uVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar25;
  uint uVar26;
  
  if (n < 1) {
    iVar4 = 1;
  }
  else {
    uVar3 = n - 1;
    auVar21 = _DAT_009de490;
    iVar4 = 4;
    uVar15 = 1;
    uVar25 = 1;
    uVar18 = 1;
    uVar26 = 1;
    do {
      uVar19 = uVar26;
      uVar17 = uVar18;
      uVar16 = uVar25;
      uVar14 = uVar15;
      uVar15 = auVar21._0_4_ * uVar14;
      uVar18 = (uint)((auVar21._8_8_ & 0xffffffff) * (ulong)uVar17);
      uVar25 = auVar21._4_4_ * uVar16;
      uVar26 = auVar21._12_4_ * uVar19;
      auVar22._0_4_ = auVar21._0_4_ + 4;
      auVar22._4_4_ = auVar21._4_4_ + 4;
      auVar22._8_4_ = auVar21._8_4_ + 4;
      auVar22._12_4_ = auVar21._12_4_ + 4;
      iVar5 = iVar4 + -4;
      iVar7 = iVar4 + (n + 3U & 0xfffffffc);
      auVar21 = auVar22;
      iVar4 = iVar5;
    } while (iVar7 != 8);
    uVar6 = -iVar5;
    uVar20 = -(uint)((int)(uVar3 ^ 0x80000000) < (int)(uVar6 ^ 0x80000000));
    uVar23 = -(uint)((int)(uVar3 ^ 0x80000000) < (int)((uVar6 | 1) ^ 0x80000000));
    uVar24 = -(uint)((int)(uVar3 ^ 0x80000000) < (int)((uVar6 | 2) ^ 0x80000000));
    uVar3 = -(uint)((int)(uVar3 ^ 0x80000000) < (int)((uVar6 | 3) ^ 0x80000000));
    iVar4 = (~uVar24 & uVar18 | uVar17 & uVar24) * (~uVar20 & uVar15 | uVar14 & uVar20) *
            (~uVar23 & uVar25 | uVar16 & uVar23) * (~uVar3 & uVar26 | uVar19 & uVar3);
  }
  piVar2 = (int *)malloc((long)iVar4 << 2);
  if (n < 1) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                  ,0x8a4,"int *Extra_PermSchedule(int)");
  }
  if (n == 1) {
LAB_00493076:
    *piVar2 = 0;
    return piVar2;
  }
  if (n == 2) {
    piVar2[1] = 0;
    goto LAB_00493076;
  }
  __ptr = Extra_PermSchedule(n + -1);
  iVar5 = (int)((long)iVar4 / (long)n);
  if (iVar5 < 2) {
    iVar7 = 0;
    if (__ptr == (int *)0x0) goto LAB_0049314e;
  }
  else {
    uVar8 = 0;
    iVar7 = 0;
    do {
      lVar10 = (long)iVar7 << 0x20;
      piVar11 = piVar2 + iVar7;
      iVar9 = iVar7 + 1;
      iVar1 = iVar7 + 3;
      iVar12 = n;
      do {
        iVar7 = iVar1;
        *piVar11 = iVar12 + -2;
        lVar10 = lVar10 + 0x100000000;
        piVar11 = piVar11 + 1;
        iVar12 = iVar12 + -1;
        iVar9 = iVar9 + 1;
        iVar1 = iVar7 + 1;
      } while (1 < iVar12);
      *(int *)((long)piVar2 + (lVar10 >> 0x1e)) = __ptr[uVar8 * 2] + 1;
      lVar10 = (long)iVar9 << 0x20;
      lVar13 = 0;
      do {
        piVar2[iVar9 + lVar13] = (int)lVar13;
        iVar7 = iVar7 + 1;
        lVar13 = lVar13 + 1;
        lVar10 = lVar10 + 0x100000000;
      } while (n + -1 != (int)lVar13);
      *(int *)((long)piVar2 + (lVar10 >> 0x1e)) = __ptr[uVar8 * 2 + 1];
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)((int)(((uint)((ulong)((long)iVar4 / (long)n) >> 0x1f) & 1) + iVar5) >>
                            1));
  }
  free(__ptr);
LAB_0049314e:
  if (iVar7 == iVar4) {
    return piVar2;
  }
  __assert_fail("b == nFact",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                ,0x8ba,"int *Extra_PermSchedule(int)");
}

Assistant:

int * Extra_PermSchedule( int n )
{
    int nFact   = Extra_Factorial(n);
    int nGroups = nFact / n / 2;
    int * pRes = ABC_ALLOC( int, nFact );
    int * pRes0, i, k, b = 0;
    assert( n > 0 );
    if ( n == 1 )
    {
        pRes[0] = 0;
        return pRes;
    }
    if ( n == 2 )
    {
        pRes[0] = pRes[1] = 0;
        return pRes;
    }
    pRes0 = Extra_PermSchedule( n-1 );
    for ( k = 0; k < nGroups; k++ )
    {
        for ( i = n-1; i > 0; i-- )
            pRes[b++] = i-1;
        pRes[b++] = pRes0[2*k]+1;
        for ( i = 0; i < n-1; i++ )
            pRes[b++] = i;
        pRes[b++] = pRes0[2*k+1];
    }
    ABC_FREE( pRes0 );
    assert( b == nFact );

    if ( 0 )
    {
        int Perm[16];
        for ( i = 0; i < n; i++ )
            Perm[i] = i;
        for ( b = 0; b < nFact; b++ )
        {
            ABC_SWAP( int, Perm[pRes[b]], Perm[pRes[b]+1] );
            printf( "%3d %3d    ", b, pRes[b] );
            for ( i = 0; i < n; i++ )
                printf( "%d", Perm[i] );
            printf( "\n" );
        }
    }
    return pRes;
}